

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseCharRef(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  char *msg;
  int iVar3;
  xmlParserErrors error;
  xmlParserInputPtr in;
  uint uVar4;
  uint val;
  
  in = ctxt->input;
  pxVar2 = in->cur;
  if ((*pxVar2 == '&') && (pxVar2[1] == '#')) {
    if (pxVar2[2] == 'x') {
      in->cur = pxVar2 + 3;
      in->col = in->col + 3;
      if (pxVar2[3] == '\0') {
        xmlParserInputGrow(in,0xfa);
        in = ctxt->input;
      }
      if ((ctxt->progressive == 0) && ((long)in->end - (long)in->cur < 0xfa)) {
        xmlGROW(ctxt);
        in = ctxt->input;
      }
      pxVar2 = in->cur;
      if (*pxVar2 == ';') {
LAB_00159d87:
        uVar4 = 0;
      }
      else {
        iVar3 = 0;
        uVar4 = 0;
        do {
          if (iVar3 < 0x15) {
            iVar3 = iVar3 + 1;
          }
          else {
            if ((ctxt->progressive == 0) && ((long)in->end - (long)pxVar2 < 0xfa)) {
              xmlGROW(ctxt);
            }
            if (ctxt->instate == XML_PARSER_EOF) {
              return 0;
            }
            in = ctxt->input;
            iVar3 = 0;
          }
          bVar1 = *in->cur;
          if (9 < (byte)(bVar1 - 0x30)) {
            if (bVar1 < 0x61) {
              if (((bVar1 < 0x41) || (0x46 < bVar1)) || (0x13 < iVar3)) goto LAB_00159eb3;
              uVar4 = (uVar4 * 0x10 + (uint)bVar1) - 0x37;
              goto LAB_00159ccf;
            }
            if ((bVar1 < 0x67) && (iVar3 < 0x14)) {
              uVar4 = (uVar4 * 0x10 + (uint)bVar1) - 0x57;
              goto LAB_00159ccf;
            }
LAB_00159eb3:
            error = XML_ERR_INVALID_HEX_CHARREF;
LAB_00159ebe:
            xmlFatalErr(ctxt,error,(char *)0x0);
            in = ctxt->input;
            pxVar2 = in->cur;
            val = 0;
            uVar4 = 0;
            if (*pxVar2 == ';') break;
            goto LAB_00159d11;
          }
          uVar4 = (uVar4 * 0x10 + (uint)bVar1) - 0x30;
LAB_00159ccf:
          if (0x10ffff < (int)uVar4) {
            uVar4 = 0x110000;
          }
          xmlNextChar(ctxt);
          iVar3 = iVar3 + 1;
          in = ctxt->input;
          pxVar2 = in->cur;
        } while (*pxVar2 != ';');
      }
    }
    else {
      in->cur = pxVar2 + 2;
      in->col = in->col + 2;
      if (pxVar2[2] == '\0') {
        xmlParserInputGrow(in,0xfa);
        in = ctxt->input;
      }
      if ((ctxt->progressive == 0) && ((long)in->end - (long)in->cur < 0xfa)) {
        xmlGROW(ctxt);
        in = ctxt->input;
      }
      pxVar2 = in->cur;
      if (*pxVar2 == ';') goto LAB_00159d87;
      iVar3 = 0;
      uVar4 = 0;
      do {
        if (iVar3 < 0x15) {
          iVar3 = iVar3 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)in->end - (long)pxVar2 < 0xfa)) {
            xmlGROW(ctxt);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return 0;
          }
          in = ctxt->input;
          iVar3 = 0;
        }
        if (9 < (byte)(*in->cur - 0x30)) {
          error = XML_ERR_INVALID_DEC_CHARREF;
          goto LAB_00159ebe;
        }
        uVar4 = ((uint)*in->cur + uVar4 * 10) - 0x30;
        if (0x10ffff < (int)uVar4) {
          uVar4 = 0x110000;
        }
        xmlNextChar(ctxt);
        iVar3 = iVar3 + 1;
        in = ctxt->input;
        pxVar2 = in->cur;
      } while (*pxVar2 != ';');
    }
    val = uVar4;
    in->col = in->col + 1;
    in->cur = pxVar2 + 1;
    if (0x10ffff < (int)val) {
      msg = "xmlParseCharRef: character reference out of bounds\n";
      goto LAB_00159d23;
    }
    if ((int)val < 0x100) {
      if (0x1f < (int)val) {
        return val;
      }
      if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) {
        return val;
      }
    }
    else if (val - 0x10000 < 0xffffd800 || val - 0xe000 < 0x1ffe) {
      return val;
    }
  }
  else {
    val = 0;
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
  }
LAB_00159d11:
  msg = "xmlParseCharRef: invalid xmlChar value %d\n";
LAB_00159d23:
  xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,msg,val);
  return 0;
}

Assistant:

int
xmlParseCharRef(xmlParserCtxtPtr ctxt) {
    int val = 0;
    int count = 0;

    /*
     * Using RAW/CUR/NEXT is okay since we are working on ASCII range here
     */
    if ((RAW == '&') && (NXT(1) == '#') &&
        (NXT(2) == 'x')) {
	SKIP(3);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(0);
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 16 + (CUR - '0');
	    else if ((RAW >= 'a') && (RAW <= 'f') && (count < 20))
	        val = val * 16 + (CUR - 'a') + 10;
	    else if ((RAW >= 'A') && (RAW <= 'F') && (count < 20))
	        val = val * 16 + (CUR - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else if  ((RAW == '&') && (NXT(1) == '#')) {
	SKIP(2);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(0);
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 10 + (CUR - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else {
        xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
    }

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseCharRef: character reference out of bounds\n",
	        val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseCharRef: invalid xmlChar value %d\n",
	                  val);
    }
    return(0);
}